

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O0

size_t __thiscall wabt::anon_unknown_0::CWriter::BeginTry(CWriter *this,TryExpr *tryexpr)

{
  size_t sVar1;
  __type _Var2;
  Index IVar3;
  reference pvVar4;
  reference pvVar5;
  Newline local_65;
  OpenBrace local_64 [2];
  Newline local_62;
  Newline local_61;
  size_t local_60;
  size_t mark;
  string_view local_50;
  undefined1 local_40 [8];
  string tlabel;
  TryExpr *tryexpr_local;
  CWriter *this_local;
  
  Write();
  local_50 = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)&tryexpr->block);
  (anonymous_namespace)::CWriter::DefineLabelName_abi_cxx11_
            ((string *)local_40,(CWriter *)this,local_50);
  (anonymous_namespace)::CWriter::
  Write<char_const(&)[24],std::__cxx11::string_const&,char_const(&)[45],wabt::(anonymous_namespace)::Newline>
            ((CWriter *)this,(char (*) [24])"WASM_RT_UNWIND_TARGET *",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
             (char (*) [45])"_outer_target = wasm_rt_get_unwind_target();",
             (Newline *)((long)&mark + 7));
  (anonymous_namespace)::CWriter::
  Write<char_const(&)[23],std::__cxx11::string_const&,char_const(&)[16],wabt::(anonymous_namespace)::Newline>
            ((CWriter *)this,(char (*) [23])"WASM_RT_UNWIND_TARGET ",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
             (char (*) [16])"_unwind_target;",(Newline *)((long)&mark + 6));
  (anonymous_namespace)::CWriter::
  Write<char_const(&)[18],std::__cxx11::string_const&,char_const(&)[18]>
            ((CWriter *)this,(char (*) [18])"if (!wasm_rt_try(",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
             (char (*) [18])"_unwind_target)) ");
  Write(this);
  IVar3 = FuncDeclaration::GetNumParams(&(tryexpr->block).decl);
  DropTypes(this,(ulong)IVar3);
  local_60 = MarkTypeStack(this);
  PushLabel(this,Try,&(tryexpr->block).label,&(tryexpr->block).decl.sig,false);
  PushTypes(this,&(tryexpr->block).decl.sig.param_types);
  (anonymous_namespace)::CWriter::
  Write<char_const(&)[28],std::__cxx11::string_const&,char_const(&)[17],wabt::(anonymous_namespace)::Newline>
            ((CWriter *)this,(char (*) [28])"wasm_rt_set_unwind_target(&",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
             (char (*) [17])"_unwind_target);",&local_61);
  PushTryCatch(this,(string *)local_40);
  Write(this,&(tryexpr->block).exprs);
  ResetTypeStack(this,local_60);
  (anonymous_namespace)::CWriter::
  Write<char_const(&)[27],std::__cxx11::string_const&,char_const(&)[16],wabt::(anonymous_namespace)::Newline>
            ((CWriter *)this,(char (*) [27])"wasm_rt_set_unwind_target(",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
             (char (*) [16])"_outer_target);",&local_62);
  Write(this);
  (anonymous_namespace)::CWriter::Write<char_const(&)[7],wabt::(anonymous_namespace)::OpenBrace>
            ((CWriter *)this,(char (*) [7])" else ",local_64);
  pvVar4 = std::
           vector<wabt::(anonymous_namespace)::Label,_std::allocator<wabt::(anonymous_namespace)::Label>_>
           ::back(&this->label_stack_);
  _Var2 = std::operator==(pvVar4->name,&(tryexpr->block).label);
  if (!_Var2) {
    __assert_fail("label_stack_.back().name == tryexpr.block.label",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/c-writer.cc"
                  ,0x9ba,"size_t wabt::(anonymous namespace)::CWriter::BeginTry(const TryExpr &)");
  }
  pvVar4 = std::
           vector<wabt::(anonymous_namespace)::Label,_std::allocator<wabt::(anonymous_namespace)::Label>_>
           ::back(&this->label_stack_);
  if (pvVar4->label_type == Try) {
    pvVar4 = std::
             vector<wabt::(anonymous_namespace)::Label,_std::allocator<wabt::(anonymous_namespace)::Label>_>
             ::back(&this->label_stack_);
    pvVar4->label_type = Catch;
    pvVar5 = std::
             vector<wabt::(anonymous_namespace)::TryCatchLabel,_std::allocator<wabt::(anonymous_namespace)::TryCatchLabel>_>
             ::back(&this->try_catch_stack_);
    if ((pvVar5->used & 1U) != 0) {
      (anonymous_namespace)::CWriter::
      Write<std::__cxx11::string_const&,char_const(&)[9],wabt::(anonymous_namespace)::Newline>
                ((CWriter *)this,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                 (char (*) [9])"_catch:;",&local_65);
    }
    sVar1 = local_60;
    std::__cxx11::string::~string((string *)local_40);
    return sVar1;
  }
  __assert_fail("label_stack_.back().label_type == LabelType::Try",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/c-writer.cc"
                ,0x9bb,"size_t wabt::(anonymous namespace)::CWriter::BeginTry(const TryExpr &)");
}

Assistant:

size_t CWriter::BeginTry(const TryExpr& tryexpr) {
  Write(OpenBrace()); /* beginning of try-catch */
  const std::string tlabel = DefineLabelName(tryexpr.block.label);
  Write("WASM_RT_UNWIND_TARGET *", tlabel,
        "_outer_target = wasm_rt_get_unwind_target();", Newline());
  Write("WASM_RT_UNWIND_TARGET ", tlabel, "_unwind_target;", Newline());
  Write("if (!wasm_rt_try(", tlabel, "_unwind_target)) ");
  Write(OpenBrace()); /* beginning of try block */
  DropTypes(tryexpr.block.decl.GetNumParams());
  const size_t mark = MarkTypeStack();
  PushLabel(LabelType::Try, tryexpr.block.label, tryexpr.block.decl.sig);
  PushTypes(tryexpr.block.decl.sig.param_types);
  Write("wasm_rt_set_unwind_target(&", tlabel, "_unwind_target);", Newline());
  PushTryCatch(tlabel);
  Write(tryexpr.block.exprs);
  ResetTypeStack(mark);
  Write("wasm_rt_set_unwind_target(", tlabel, "_outer_target);", Newline());
  Write(CloseBrace());          /* end of try block */
  Write(" else ", OpenBrace()); /* beginning of catch blocks or delegate */
  assert(label_stack_.back().name == tryexpr.block.label);
  assert(label_stack_.back().label_type == LabelType::Try);
  label_stack_.back().label_type = LabelType::Catch;
  if (try_catch_stack_.back().used) {
    Write(tlabel, "_catch:;", Newline());
  }

  return mark;
}